

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

VP8StatusCode VP8EnterCritical(VP8Decoder *dec,VP8Io *io)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  VP8FInfo (*paVVar7) [2];
  uint uVar8;
  uint uVar9;
  int s;
  long lVar10;
  long lVar11;
  uint8_t uVar12;
  
  if ((io->setup != (VP8IoSetupHook)0x0) && (iVar2 = (*io->setup)(io), iVar2 == 0)) {
    VP8SetError(dec,VP8_STATUS_USER_ABORT,"Frame setup failed");
    return dec->status;
  }
  if (io->bypass_filtering == 0) {
    iVar2 = dec->filter_type;
    uVar3 = (uint)""[iVar2];
    if ((long)iVar2 != 2) goto LAB_00124b12;
    dec->tl_mb_x = 0;
    iVar2 = 2;
  }
  else {
    dec->filter_type = 0;
    uVar3 = 0;
    iVar2 = 0;
LAB_00124b12:
    iVar5 = (int)(io->crop_left - uVar3) >> 4;
    dec->tl_mb_x = iVar5;
    iVar4 = (int)(io->crop_top - uVar3) >> 4;
    dec->tl_mb_y = iVar4;
    if (iVar5 < 0) {
      dec->tl_mb_x = 0;
    }
    if (-1 < iVar4) goto LAB_00124b4c;
  }
  dec->tl_mb_y = 0;
LAB_00124b4c:
  iVar5 = (int)(io->crop_bottom + uVar3 + 0xf) >> 4;
  dec->br_mb_y = iVar5;
  iVar4 = (int)(uVar3 + 0xf + io->crop_right) >> 4;
  if (dec->mb_w <= iVar4) {
    iVar4 = dec->mb_w;
  }
  dec->br_mb_x = iVar4;
  if (dec->mb_h < iVar5) {
    dec->br_mb_y = dec->mb_h;
  }
  if (0 < iVar2) {
    iVar2 = (dec->filter_hdr).use_lf_delta;
    iVar4 = (dec->segment_hdr).use_segment;
    paVVar7 = dec->fstrengths;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      if (iVar4 == 0) {
        uVar3 = (dec->filter_hdr).level;
      }
      else {
        uVar3 = (uint)(dec->segment_hdr).filter_strength[lVar10];
        if ((dec->segment_hdr).absolute_delta == 0) {
          uVar3 = uVar3 + (dec->filter_hdr).level;
        }
      }
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        uVar8 = uVar3;
        if ((iVar2 != 0) && (uVar8 = (dec->filter_hdr).ref_lf_delta[0] + uVar3, lVar11 != 0)) {
          uVar8 = uVar8 + (dec->filter_hdr).mode_lf_delta[0];
        }
        uVar6 = 0x3f;
        if ((int)uVar8 < 0x3f) {
          uVar6 = uVar8;
        }
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        if ((int)uVar8 < 1) {
          (*paVVar7)[lVar11].f_limit = '\0';
        }
        else {
          uVar1 = (dec->filter_hdr).sharpness;
          uVar9 = uVar6;
          if (0 < (int)uVar1) {
            uVar9 = uVar6 >> (2U - (uVar1 < 5) & 0x1f);
            if ((int)(9 - uVar1) <= (int)uVar9) {
              uVar9 = 9 - uVar1;
            }
          }
          if ((int)uVar9 < 2) {
            uVar9 = 1;
          }
          (*paVVar7)[lVar11].f_ilevel = (uint8_t)uVar9;
          (*paVVar7)[lVar11].f_limit = (uint8_t)uVar9 + (char)uVar6 * '\x02';
          uVar12 = 0xe < uVar8;
          if (0x27 < uVar8) {
            uVar12 = '\x02';
          }
          (*paVVar7)[lVar11].hev_thresh = uVar12;
        }
        (*paVVar7)[lVar11].f_inner = (uint8_t)lVar11;
      }
      paVVar7 = paVVar7 + 1;
    }
  }
  return VP8_STATUS_OK;
}

Assistant:

VP8StatusCode VP8EnterCritical(VP8Decoder* const dec, VP8Io* const io) {
  // Call setup() first. This may trigger additional decoding features on 'io'.
  // Note: Afterward, we must call teardown() no matter what.
  if (io->setup != NULL && !io->setup(io)) {
    VP8SetError(dec, VP8_STATUS_USER_ABORT, "Frame setup failed");
    return dec->status;
  }

  // Disable filtering per user request
  if (io->bypass_filtering) {
    dec->filter_type = 0;
  }

  // Define the area where we can skip in-loop filtering, in case of cropping.
  //
  // 'Simple' filter reads two luma samples outside of the macroblock
  // and filters one. It doesn't filter the chroma samples. Hence, we can
  // avoid doing the in-loop filtering before crop_top/crop_left position.
  // For the 'Complex' filter, 3 samples are read and up to 3 are filtered.
  // Means: there's a dependency chain that goes all the way up to the
  // top-left corner of the picture (MB #0). We must filter all the previous
  // macroblocks.
  {
    const int extra_pixels = kFilterExtraRows[dec->filter_type];
    if (dec->filter_type == 2) {
      // For complex filter, we need to preserve the dependency chain.
      dec->tl_mb_x = 0;
      dec->tl_mb_y = 0;
    } else {
      // For simple filter, we can filter only the cropped region.
      // We include 'extra_pixels' on the other side of the boundary, since
      // vertical or horizontal filtering of the previous macroblock can
      // modify some abutting pixels.
      dec->tl_mb_x = (io->crop_left - extra_pixels) >> 4;
      dec->tl_mb_y = (io->crop_top - extra_pixels) >> 4;
      if (dec->tl_mb_x < 0) dec->tl_mb_x = 0;
      if (dec->tl_mb_y < 0) dec->tl_mb_y = 0;
    }
    // We need some 'extra' pixels on the right/bottom.
    dec->br_mb_y = (io->crop_bottom + 15 + extra_pixels) >> 4;
    dec->br_mb_x = (io->crop_right + 15 + extra_pixels) >> 4;
    if (dec->br_mb_x > dec->mb_w) {
      dec->br_mb_x = dec->mb_w;
    }
    if (dec->br_mb_y > dec->mb_h) {
      dec->br_mb_y = dec->mb_h;
    }
  }
  PrecomputeFilterStrengths(dec);
  return VP8_STATUS_OK;
}